

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_pack8to1.h
# Opt level: O0

void ncnn::deconvolution_pack8to1_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  float *pfVar7;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar8;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w;
  __m256 _val;
  int k;
  float *sptr;
  int sx;
  int sxs;
  int x;
  int sy;
  int sys;
  int y;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  float sum;
  int j;
  int i;
  int outh;
  int outw;
  int channels;
  int h;
  int w;
  int maxk;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int kernel_extent_h;
  int kernel_extent_w;
  int outch;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  __m128 x32;
  __m128 x64;
  __m128 x128;
  float local_764;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  int local_684;
  undefined1 (*local_680) [32];
  int local_678;
  int local_674;
  int local_670;
  int local_66c;
  int local_668;
  int local_664;
  undefined8 local_660;
  undefined8 local_658;
  undefined8 local_650;
  undefined4 local_648;
  long local_640;
  undefined4 local_638;
  undefined4 local_634;
  undefined4 local_630;
  undefined4 local_62c;
  undefined4 local_628;
  undefined8 local_620;
  int local_614;
  undefined8 local_610;
  undefined8 local_608;
  undefined8 local_600;
  undefined4 local_5f8;
  long local_5f0;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined8 local_5d0;
  long local_5c8;
  undefined1 local_5c0 [32];
  float local_5a0;
  int local_59c;
  int local_598;
  int local_594;
  int local_590;
  int local_58c;
  int local_588;
  int local_584;
  int local_580;
  undefined8 local_570;
  undefined8 local_568;
  undefined8 local_560;
  undefined4 local_558;
  long local_550;
  undefined4 local_548;
  undefined4 local_544;
  undefined4 local_540;
  undefined4 local_53c;
  undefined4 local_538;
  undefined8 local_530;
  float *local_528;
  int local_51c;
  long local_518;
  int local_50c;
  int local_508;
  int local_504;
  int local_500;
  int local_4fc;
  long *local_4f0;
  long *local_4e8;
  long *local_4e0;
  undefined1 local_4d5;
  int local_4d4;
  undefined8 *local_4c8;
  undefined8 *local_4b8;
  undefined8 *local_4a8;
  undefined8 *local_498;
  undefined8 *local_488;
  undefined8 *local_468;
  undefined8 *local_448;
  undefined8 *local_428;
  undefined8 *local_410;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 (*local_3e0) [32];
  undefined1 (*local_3d8) [32];
  undefined1 local_3cd;
  int local_3cc;
  undefined8 *local_3c0;
  undefined1 local_39d;
  int local_39c;
  undefined8 *local_390;
  int local_36c;
  undefined8 *local_368;
  float local_35c;
  float local_358;
  float local_354;
  float local_350;
  float local_34c;
  float local_348;
  float local_344;
  float local_340;
  float local_33c;
  long *local_338;
  int local_330;
  float local_32c [3];
  long *local_320;
  undefined8 local_318;
  long *local_310;
  undefined8 local_308;
  long *local_300;
  undefined8 local_2f8;
  long *local_2f0;
  undefined8 local_2e8;
  long *local_2e0;
  long local_2d8;
  undefined4 local_2cc;
  long local_2c8;
  long local_2c0;
  undefined4 local_2b4;
  int local_2b0;
  int local_2ac;
  undefined8 *local_2a8;
  long local_2a0;
  undefined4 local_294;
  long local_290;
  long local_288;
  undefined4 local_27c;
  int local_278;
  int local_274;
  undefined8 *local_270;
  long local_268;
  undefined4 local_25c;
  long local_258;
  float *local_250;
  undefined4 local_244;
  int local_240;
  int local_23c;
  undefined8 *local_238;
  undefined4 local_22c;
  long local_228;
  undefined4 local_21c;
  long local_218;
  undefined4 local_20c;
  long local_208;
  undefined1 *local_1b8;
  undefined8 *local_1b0;
  undefined8 *local_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  ulong local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float local_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  undefined1 local_50 [16];
  ulong local_40;
  undefined8 uStack_38;
  
  local_504 = (int)in_RSI[7];
  local_508 = in_stack_00000008 * (in_R8D + -1) + 1;
  local_50c = dilation_w * (in_R9D + -1) + 1;
  local_518 = *in_RCX;
  local_500 = in_R9D;
  local_4fc = in_R8D;
  local_4f0 = in_RDX;
  local_4e8 = in_RSI;
  local_4e0 = in_RDI;
  for (local_51c = 0; local_51c < local_504; local_51c = local_51c + 1) {
    local_4c8 = &local_570;
    local_23c = *(int *)((long)local_4e8 + 0x2c);
    local_240 = (int)local_4e8[6];
    local_244 = *(undefined4 *)((long)local_4e8 + 0x34);
    local_528 = (float *)(*local_4e8 + local_4e8[8] * (long)local_51c * local_4e8[2]);
    local_258 = local_4e8[2];
    local_25c = (undefined4)local_4e8[3];
    local_268 = local_4e8[4];
    local_238 = &local_570;
    local_228 = (long)local_23c * (long)local_240 * local_258;
    local_488 = &local_570;
    local_4b8 = &local_570;
    local_22c = 0x10;
    local_4d4 = local_51c;
    local_4d5 = 1;
    local_570 = 0;
    local_560 = 0;
    local_558 = 0;
    local_548 = 0;
    local_544 = 0;
    local_540 = 0;
    local_53c = 0;
    local_538 = 0;
    local_530 = 0;
    local_568 = 0;
    local_580 = local_4fc * local_500;
    local_584 = *(int *)((long)local_4e0 + 0x2c);
    local_588 = (int)local_4e0[6];
    local_58c = (int)local_4e0[7];
    local_590 = *(int *)((long)local_4e8 + 0x2c);
    local_594 = (int)local_4e8[6];
    local_428 = local_4b8;
    local_250 = local_528;
    local_550 = local_268;
    for (local_598 = 0; local_598 < local_594; local_598 = local_598 + 1) {
      for (local_59c = 0; local_59c < local_590; local_59c = local_59c + 1) {
        local_5a0 = 0.0;
        if (local_518 != 0) {
          local_5a0 = *(float *)(local_518 + (long)local_51c * 4);
        }
        local_5c0 = ZEXT1632(ZEXT816(0));
        local_390 = &local_610;
        local_2ac = *(int *)((long)local_4f0 + 0x2c);
        local_2b0 = (int)local_4f0[6];
        local_2b4 = *(undefined4 *)((long)local_4f0 + 0x34);
        local_2c0 = *local_4f0 + local_4f0[8] * (long)local_51c * local_4f0[2];
        local_2c8 = local_4f0[2];
        local_2cc = (undefined4)local_4f0[3];
        local_2d8 = local_4f0[4];
        local_2a8 = &local_610;
        local_208 = (long)local_2ac * (long)local_2b0 * local_2c8;
        local_410 = &local_610;
        local_4a8 = &local_610;
        local_20c = 0x10;
        local_39c = local_51c;
        local_39d = 1;
        uStack_3e8 = 0;
        uStack_3f0 = 0;
        uStack_3f8 = 0;
        local_400 = 0;
        local_610 = 0;
        local_600 = 0;
        local_5f8 = 0;
        local_5e8 = 0;
        local_5e4 = 0;
        local_5e0 = 0;
        local_5dc = 0;
        local_5d8 = 0;
        local_5d0 = 0;
        local_608 = 0;
        local_5c8 = local_2c0;
        for (local_614 = 0; local_614 < local_58c; local_614 = local_614 + 1) {
          local_3c0 = &local_660;
          local_274 = *(int *)((long)local_4e0 + 0x2c);
          local_278 = (int)local_4e0[6];
          local_27c = *(undefined4 *)((long)local_4e0 + 0x34);
          local_288 = *local_4e0 + local_4e0[8] * (long)local_614 * local_4e0[2];
          local_290 = local_4e0[2];
          local_294 = (undefined4)local_4e0[3];
          local_2a0 = local_4e0[4];
          local_270 = &local_660;
          local_218 = (long)local_274 * (long)local_278 * local_290;
          for (local_664 = 0; local_664 < local_500; local_664 = local_664 + 1) {
            local_668 = (local_598 + local_664 * dilation_w) - (local_50c + -1);
            if (((-1 < local_668) && (local_668 % stride_w == 0)) &&
               (local_66c = local_668 / stride_w, local_66c < local_588)) {
              for (local_670 = 0; local_670 < local_4fc; local_670 = local_670 + 1) {
                local_674 = (local_59c + local_670 * in_stack_00000008) - (local_508 + -1);
                if (((-1 < local_674) && (local_674 % dilation_h == 0)) &&
                   (local_678 = local_674 / dilation_h, local_678 < local_584)) {
                  local_368 = &local_660;
                  local_680 = (undefined1 (*) [32])
                              (local_288 + (long)local_274 * (long)local_66c * local_290 +
                              (long)(local_678 << 3) * 4);
                  local_684 = local_664 * local_4fc + local_670;
                  local_6c0 = *(undefined8 *)*local_680;
                  uStack_6b8 = *(undefined8 *)(*local_680 + 8);
                  uStack_6b0 = *(undefined8 *)(*local_680 + 0x10);
                  uStack_6a8 = *(undefined8 *)(*local_680 + 0x18);
                  local_3e0 = (undefined1 (*) [32])(local_5c8 + (long)(local_684 * 8) * 4);
                  local_6e0 = *(undefined8 *)*local_3e0;
                  uStack_6d8 = *(undefined8 *)(*local_3e0 + 8);
                  uStack_6d0 = *(undefined8 *)(*local_3e0 + 0x10);
                  uStack_6c8 = *(undefined8 *)(*local_3e0 + 0x18);
                  local_1a8 = &local_6c0;
                  local_1b0 = &local_6e0;
                  local_1b8 = local_5c0;
                  local_1a0 = local_5c0._0_8_;
                  uStack_198 = local_5c0._8_8_;
                  uStack_190 = local_5c0._16_8_;
                  uStack_188 = local_5c0._24_8_;
                  auVar1 = vfmadd213ps_fma(*local_3e0,*local_680,local_5c0);
                  local_5c0 = ZEXT1632(auVar1);
                  local_3d8 = local_680;
                  local_36c = local_66c;
                  local_180 = local_6e0;
                  uStack_178 = uStack_6d8;
                  uStack_170 = uStack_6d0;
                  uStack_168 = uStack_6c8;
                  local_160 = local_6c0;
                  uStack_158 = uStack_6b8;
                  uStack_150 = uStack_6b0;
                  uStack_148 = uStack_6a8;
                }
              }
            }
          }
          local_5c8 = local_5c8 + (long)(local_580 << 3) * 4;
          local_498 = &local_660;
          local_21c = 0x10;
          local_3cc = local_614;
          local_3cd = 1;
          local_660 = 0;
          local_650 = 0;
          local_648 = 0;
          local_638 = 0;
          local_634 = 0;
          local_630 = 0;
          local_62c = 0;
          local_628 = 0;
          local_620 = 0;
          local_658 = 0;
          local_468 = local_498;
          local_640 = local_2a0;
        }
        local_100 = local_5c0._0_8_;
        uStack_f8 = local_5c0._8_8_;
        uStack_f0 = local_5c0._16_8_;
        uStack_e8 = local_5c0._24_8_;
        local_a0 = local_5c0._0_8_;
        uStack_98 = local_5c0._8_8_;
        uStack_90 = local_5c0._16_8_;
        uStack_88 = local_5c0._24_8_;
        local_b0 = local_5c0._16_8_;
        uVar5 = local_b0;
        uStack_a8 = local_5c0._24_8_;
        uVar6 = uStack_a8;
        local_c0 = local_5c0._0_8_;
        uVar3 = local_c0;
        uStack_b8 = local_5c0._8_8_;
        uVar4 = uStack_b8;
        local_b0._0_4_ = local_5c0._16_4_;
        local_b0._4_4_ = local_5c0._20_4_;
        uStack_a8._0_4_ = local_5c0._24_4_;
        uStack_a8._4_4_ = local_5c0._28_4_;
        local_c0._0_4_ = local_5c0._0_4_;
        local_c0._4_4_ = local_5c0._4_4_;
        uStack_b8._0_4_ = local_5c0._8_4_;
        uStack_b8._4_4_ = local_5c0._12_4_;
        local_110 = (float)local_b0 + (float)local_c0;
        fStack_10c = local_b0._4_4_ + local_c0._4_4_;
        fStack_108 = (float)uStack_a8 + (float)uStack_b8;
        fStack_104 = uStack_a8._4_4_ + uStack_b8._4_4_;
        local_d0 = CONCAT44(fStack_10c,local_110);
        uStack_c8 = CONCAT44(fStack_104,fStack_108);
        auVar2._8_8_ = uStack_c8;
        auVar2._0_8_ = local_d0;
        auVar1._8_8_ = uStack_c8;
        auVar1._0_8_ = local_d0;
        _local_e0 = vunpckhpd_avx(auVar1,auVar2);
        local_120 = local_110 + (float)local_e0._0_4_;
        fStack_11c = fStack_10c + (float)local_e0._4_4_;
        fStack_118 = fStack_108 + fStack_d8;
        fStack_114 = fStack_104 + fStack_d4;
        local_50._0_4_ = local_120 + fStack_11c;
        local_50._4_4_ = 0;
        local_130 = local_50._0_8_;
        uStack_128 = 0;
        local_40 = local_50._0_8_;
        uStack_38 = 0;
        local_764 = local_5a0 + (float)local_50._0_4_;
        local_338 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_330 = stride_h;
        local_32c[0] = local_764;
        local_5a0 = local_764;
        local_448 = local_4a8;
        local_c0 = uVar3;
        uStack_b8 = uVar4;
        local_b0 = uVar5;
        uStack_a8 = uVar6;
        local_80 = local_d0;
        uStack_78 = uStack_c8;
        local_70 = local_d0;
        uStack_68 = uStack_c8;
        local_60 = fStack_11c;
        fStack_5c = fStack_11c;
        fStack_58 = fStack_11c;
        fStack_54 = fStack_11c;
        local_50 = ZEXT416((uint)local_50._0_4_);
        local_5f0 = local_2d8;
        switch(stride_h) {
        case 1:
          auVar1 = vmaxss_avx(ZEXT416((uint)local_764),(undefined1  [16])0x0);
          local_32c[0] = auVar1._0_4_;
          break;
        case 2:
          local_2e8 = 0;
          local_33c = *(float *)*local_338;
          if (local_764 <= 0.0) {
            local_764 = local_764 * local_33c;
          }
          local_32c[0] = local_764;
          local_2e0 = local_338;
          break;
        case 3:
          local_2f8 = 0;
          local_340 = *(float *)*local_338;
          local_308 = 1;
          local_344 = *(float *)(*local_338 + 4);
          if (local_764 < local_340) {
            local_32c[0] = local_340;
          }
          local_300 = local_338;
          local_2f0 = local_338;
          if (local_344 < local_32c[0]) {
            local_32c[0] = local_344;
          }
          break;
        case 4:
          local_348 = 88.37626;
          pfVar7 = std::min<float>(local_32c,&local_348);
          local_32c[0] = *pfVar7;
          local_34c = -88.37626;
          pfVar7 = std::max<float>(local_32c,&local_34c);
          local_32c[0] = *pfVar7;
          fVar8 = expf(-local_32c[0]);
          local_32c[0] = 1.0 / (fVar8 + 1.0);
          break;
        case 5:
          fVar8 = expf(local_764);
          fVar8 = logf(fVar8 + 1.0);
          local_32c[0] = tanhf(fVar8);
          local_32c[0] = local_764 * local_32c[0];
          break;
        case 6:
          local_318 = 0;
          local_350 = *(float *)*local_338;
          local_32c[1] = 1.4013e-45;
          local_32c[2] = 0.0;
          local_354 = *(float *)(*local_338 + 4);
          local_358 = -local_354 / local_350;
          local_35c = 1.0 / local_350 + local_358;
          local_320 = local_338;
          local_310 = local_338;
          if (local_358 <= local_764) {
            if (local_764 <= local_35c) {
              local_32c[0] = local_764 * (local_764 * local_350 + local_354);
            }
          }
          else {
            local_32c[0] = 0.0;
          }
        }
        *local_528 = local_32c[0];
        local_528 = local_528 + 1;
      }
    }
  }
  return;
}

Assistant:

static void deconvolution_pack8to1_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int outch = top_blob.c;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const float* bias_data_ptr = bias_data;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        const int maxk = kernel_w * kernel_h;

        // shadowed variable for less openmp task args
        const int w = bottom_blob.w;
        const int h = bottom_blob.h;
        const int channels = bottom_blob.c;
        const int outw = top_blob.w;
        const int outh = top_blob.h;

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_data_ptr)
                {
                    sum = bias_data_ptr[p];
                }

                __m256 _sum = _mm256_setzero_ps();

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);

                    for (int y = 0; y < kernel_h; y++)
                    {
                        int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                        if (sys < 0 || sys % stride_h != 0)
                            continue;

                        int sy = sys / stride_h;
                        if (sy >= h)
                            continue;

                        for (int x = 0; x < kernel_w; x++)
                        {
                            int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                            if (sxs < 0 || sxs % stride_w != 0)
                                continue;

                            int sx = sxs / stride_w;
                            if (sx >= w)
                                continue;

                            const float* sptr = m.row(sy) + sx * 8;

                            int k = y * kernel_w + x;

                            __m256 _val = _mm256_load_ps(sptr);
                            __m256 _w = _mm256_load_ps(kptr + k * 8);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);
                        }
                    }

                    kptr += maxk * 8;
                }

                sum += _mm256_reduce_add_ps(_sum);

                sum = activation_ss(sum, activation_type, activation_params);

                outptr[0] = sum;
                outptr++;
            }
        }
    }
}